

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::WildcardPattern::normaliseString(WildcardPattern *this,string *str)

{
  string *in_RDX;
  long in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  string *in_stack_ffffffffffffffb8;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RSI + 8) == 1) {
    toLower(in_stack_ffffffffffffffb8);
  }
  else {
    std::__cxx11::string::string(local_28,in_RDX);
  }
  trim(in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string WildcardPattern::normaliseString( std::string const& str ) const {
        return trim( m_caseSensitivity == CaseSensitive::No ? toLower( str ) : str );
    }